

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

CTypeID cp_decl_constinit(CPState *cp,CType **ctp,CTypeID ctypeid)

{
  uint uVar1;
  CType *pCVar2;
  anon_union_4_2_43a9a9ed_for_CPValue_0 in_EAX;
  CTypeID CVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  anon_union_4_2_43a9a9ed_for_CPValue_0 local_38 [2];
  
  pCVar2 = cp->cts->tab;
  uVar1 = pCVar2[ctypeid].info;
  if (((uVar1 < 0x4000000) && (0x1ffffff < uVar1)) && (uVar6 = pCVar2[ctypeid].size, uVar6 < 5)) {
    local_38[0] = in_EAX;
    cp_check(cp,0x3d);
    cp_expr_sub(cp,(CPValue *)local_38,0);
    CVar3 = lj_ctype_new(cp->cts,ctp);
    pCVar2 = *ctp;
    pCVar2->info = (ctypeid | 0x2000000) + 0xb0000000;
    bVar4 = -(char)(uVar6 << 3);
    uVar5 = local_38[0].u32 << (bVar4 & 0x1f);
    uVar6 = uVar5 >> (bVar4 & 0x1f);
    if ((uVar1 >> 0x17 & 1) == 0) {
      uVar6 = (int)uVar5 >> (bVar4 & 0x1f);
    }
    pCVar2->size = uVar6;
    return CVar3;
  }
  cp_err(cp,LJ_ERR_FFI_INVTYPE);
}

Assistant:

static CTypeID cp_decl_constinit(CPState *cp, CType **ctp, CTypeID ctypeid)
{
  CType *ctt = ctype_get(cp->cts, ctypeid);
  CTInfo info;
  CTSize size;
  CPValue k;
  CTypeID constid;
  while (ctype_isattrib(ctt->info)) {  /* Skip attributes. */
    ctypeid = ctype_cid(ctt->info);  /* Update ID, too. */
    ctt = ctype_get(cp->cts, ctypeid);
  }
  info = ctt->info;
  size = ctt->size;
  if (!ctype_isinteger(info) || !(info & CTF_CONST) || size > 4)
    cp_err(cp, LJ_ERR_FFI_INVTYPE);
  cp_check(cp, '=');
  cp_expr_sub(cp, &k, 0);
  constid = lj_ctype_new(cp->cts, ctp);
  (*ctp)->info = CTINFO(CT_CONSTVAL, CTF_CONST|ctypeid);
  k.u32 <<= 8*(4-size);
  if ((info & CTF_UNSIGNED))
    k.u32 >>= 8*(4-size);
  else
    k.u32 = (uint32_t)((int32_t)k.u32 >> 8*(4-size));
  (*ctp)->size = k.u32;
  return constid;
}